

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseLabelOpt(WastParser *this,string *out_label)

{
  TokenType TVar1;
  allocator<char> local_89;
  string_view local_88;
  string local_78 [32];
  Token local_58;
  
  TVar1 = Peek(this,0);
  if (TVar1 == Last_String) {
    Consume(&local_58,this);
    local_88 = Token::text(&local_58);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_78,&local_88,&local_89);
    std::__cxx11::string::operator=((string *)out_label,local_78);
    std::__cxx11::string::_M_dispose();
  }
  else {
    out_label->_M_string_length = 0;
    *(out_label->_M_dataplus)._M_p = '\0';
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseLabelOpt(std::string* out_label) {
  WABT_TRACE(ParseLabelOpt);
  if (PeekMatch(TokenType::Var)) {
    *out_label = std::string(Consume().text());
  } else {
    out_label->clear();
  }
  return Result::Ok;
}